

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool merlin::dominates(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *A,set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *B)

{
  _Rb_tree_header *__last1;
  bool bVar1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> temp;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_40;
  
  __last1 = &local_40._M_impl.super__Rb_tree_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_left = &__last1->_M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right = &__last1->_M_header;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>,std::insert_iterator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((A->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(A->_M_t)._M_impl.super__Rb_tree_header,
             (B->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(B->_M_t)._M_impl.super__Rb_tree_header,&local_40,__last1);
  if (local_40._M_impl.super__Rb_tree_header._M_node_count ==
      (B->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar1 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>>
                      ((_Rb_tree_const_iterator<unsigned_long>)
                       local_40._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<unsigned_long>)__last1,
                       (B->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar1 = false;
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_40);
  return bVar1;
}

Assistant:

bool dominates(std::set<size_t>& A, std::set<size_t>& B) {
	std::set<size_t> temp;
	std::set_intersection(A.begin(), A.end(),
			B.begin(), B.end(),
			std::inserter(temp, temp.begin()));

	return (temp == B);
}